

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_endpointer.c
# Opt level: O0

int16 * ps_endpointer_end_stream(ps_endpointer_t *ep,int16 *frame,size_t nsamp,size_t *out_nsamp)

{
  int iVar1;
  ps_vad_t *vad;
  undefined4 uVar2;
  int local_34;
  size_t *psStack_30;
  int is_speech;
  size_t *out_nsamp_local;
  size_t nsamp_local;
  int16 *frame_local;
  ps_endpointer_t *ep_local;
  undefined1 auVar3 [16];
  
  psStack_30 = out_nsamp;
  out_nsamp_local = (size_t *)nsamp;
  nsamp_local = (size_t)frame;
  frame_local = (int16 *)ep;
  if ((ulong)(long)ep->frame_size < nsamp) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_endpointer.c"
            ,0xf1,"Final frame must be %d samples or less\n",(ulong)(uint)ep->frame_size);
    ep_local = (ps_endpointer_t *)0x0;
  }
  else {
    if (out_nsamp != (size_t *)0x0) {
      *out_nsamp = 0;
    }
    if (ep->in_speech == 0) {
      ep_local = (ps_endpointer_t *)0x0;
    }
    else {
      ep->in_speech = 0;
      ep->speech_end = ep->qstart_time;
      ep_linearize(ep);
      if (*(int *)(frame_local + 0x20) != 0) {
        __assert_fail("ep->pos == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_endpointer.c"
                      ,0xfe,
                      "const int16 *ps_endpointer_end_stream(ps_endpointer_t *, const int16 *, size_t, size_t *)"
                     );
      }
      while ((iVar1 = ep_empty((ps_endpointer_t *)frame_local), iVar1 == 0 &&
             (ep_pop((ps_endpointer_t *)frame_local,&local_34), local_34 != 0))) {
        if (psStack_30 != (size_t *)0x0) {
          *psStack_30 = (long)*(int *)(frame_local + 0x12) + *psStack_30;
        }
        *(undefined8 *)(frame_local + 0x30) = *(undefined8 *)(frame_local + 0x24);
      }
      iVar1 = ep_empty((ps_endpointer_t *)frame_local);
      if (iVar1 != 0) {
        if ((*(double *)(frame_local + 0x30) == *(double *)(frame_local + 0x24)) &&
           (!NAN(*(double *)(frame_local + 0x30)) && !NAN(*(double *)(frame_local + 0x24)))) {
          if (*(int *)(frame_local + 0x20) == *(int *)(frame_local + 0x14)) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_endpointer.c"
                    ,0x10d,"VAD queue overflow (should not happen)");
          }
          else {
            auVar3._8_4_ = (int)((ulong)out_nsamp_local >> 0x20);
            auVar3._0_8_ = out_nsamp_local;
            auVar3._12_4_ = 0x45300000;
            uVar2 = SUB84(out_nsamp_local,0);
            vad = ps_endpointer_vad((ps_endpointer_t *)frame_local);
            iVar1 = ps_vad_sample_rate(vad);
            *(double *)(frame_local + 0x28) =
                 ((auVar3._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,uVar2) - 4503599627370496.0)) / (double)iVar1 +
                 *(double *)(frame_local + 0x28);
            if (psStack_30 != (size_t *)0x0) {
              *psStack_30 = (long)out_nsamp_local + *psStack_30;
            }
            memcpy((void *)(*(long *)(frame_local + 0x18) +
                           (long)(*(int *)(frame_local + 0x20) * *(int *)(frame_local + 0x12)) * 2),
                   (void *)nsamp_local,(long)out_nsamp_local << 1);
            *(undefined8 *)(frame_local + 0x30) = *(undefined8 *)(frame_local + 0x28);
          }
        }
      }
      ep_clear((ps_endpointer_t *)frame_local);
      ep_local = *(ps_endpointer_t **)(frame_local + 0x18);
    }
  }
  return (int16 *)ep_local;
}

Assistant:

const int16 *
ps_endpointer_end_stream(ps_endpointer_t *ep,
                         const int16 *frame,
                         size_t nsamp,
                         size_t *out_nsamp)
{
    if (nsamp > (size_t)ep->frame_size) {
        E_ERROR("Final frame must be %d samples or less\n",
                ep->frame_size);
        return NULL;
    }
    
    if (out_nsamp)
        *out_nsamp = 0;
    if (!ep->in_speech)
        return NULL;
    ep->in_speech = FALSE;
    ep->speech_end = ep->qstart_time;

    /* Rotate the buffer so we can return data in a single call. */
    ep_linearize(ep);
    assert(ep->pos == 0);
    while (!ep_empty(ep)) {
        int is_speech;
        ep_pop(ep, &is_speech);
        if (is_speech) {
            if (out_nsamp)
                *out_nsamp += ep->frame_size;
            ep->speech_end = ep->qstart_time;
        }
        else
            break;
    }
    /* If we used all the VAD queue, add the trailing samples. */
    if (ep_empty(ep) && ep->speech_end == ep->qstart_time) {
        if (ep->pos == ep->maxlen) {
            E_ERROR("VAD queue overflow (should not happen)");
            /* Not fatal, we just lose data. */
        }
        else {
            ep->timestamp +=
                (double)nsamp / ps_endpointer_sample_rate(ep);
            if (out_nsamp)
                *out_nsamp += nsamp;
            memcpy(ep->buf + ep->pos * ep->frame_size,
                   frame, nsamp * sizeof(*ep->buf));
            ep->speech_end = ep->timestamp;
        }
    }
    ep_clear(ep);
    return ep->buf;
}